

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ani2h264raw.cpp
# Opt level: O3

void parse(int argc,char **argv)

{
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var1;
  uint uVar2;
  __node_base *p_Var3;
  undefined8 uVar4;
  OptionAdder *pOVar5;
  size_t sVar6;
  OptionValue *pOVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  ostream *poVar8;
  long *plVar9;
  __hashtable *__h;
  long lVar10;
  pointer pbVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ParseResult result;
  undefined1 local_4e9;
  undefined1 local_4e8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_4c0;
  uint *local_4b8;
  pointer local_4b0;
  uint local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_478;
  undefined1 local_468 [32];
  _Alloc_hider local_448;
  size_type local_440;
  undefined1 auStack_438 [16];
  _Alloc_hider _Stack_428;
  __node_base local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_418;
  size_t local_408;
  __node_base_ptr p_Stack_400;
  string local_3f8;
  pointer local_3d8;
  pointer pbStack_3d0;
  __node_base *local_3c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  __node_base local_3b8 [2];
  string local_3a8;
  string local_388;
  shared_ptr<const_cxxopts::Value> local_368;
  shared_ptr<const_cxxopts::Value> local_358;
  shared_ptr<const_cxxopts::Value> local_348;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [20];
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_240;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,*argv,(allocator<char> *)local_498);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2b8," - ani files to h264 bitstream converter","");
  cxxopts::Options::Options((Options *)local_1a8,&local_298,&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"[optional args]","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1a8 + 0x60)
             ,&local_1c8);
  local_1a8[0x80] = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8._136_8_ = 0x46;
  local_1a8[0x90] = true;
  local_1a8[0x81] = true;
  local_4b8 = &local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
  uVar2 = local_4a8;
  local_488._0_8_ = local_4b0;
  if (local_4b8 == &local_4a8) {
    uStack_260 = uStack_4a0;
    uStack_25c = uStack_49c;
    local_4b8 = (uint *)(local_278 + 0x10);
  }
  uStack_264 = uStack_4a4;
  local_278._16_4_ = local_4a8;
  local_4b0 = (pointer)0x0;
  local_4a8 = local_4a8 & 0xffffff00;
  local_498._8_8_ = local_488 + 8;
  if (local_4b8 == (uint *)(local_278 + 0x10)) {
    local_488._8_8_ = CONCAT44(uStack_4a4,uVar2);
    aStack_478._4_4_ = uStack_25c;
    aStack_478._0_4_ = uStack_260;
  }
  else {
    local_488._8_8_ = stack0xfffffffffffffd98;
    local_498._8_8_ = local_4b8;
  }
  local_278._0_8_ = local_278 + 0x10;
  local_4b8 = &local_4a8;
  local_498._0_8_ = (Options *)local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"i,input","");
  local_4e8._0_8_ = local_4e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"Input","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_3f8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_3a8);
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       local_3f8._M_dataplus._M_p._0_1_;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_3_ =
       local_3f8._M_dataplus._M_p._1_3_;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       local_3f8._M_dataplus._M_p._4_4_;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = (undefined4)local_3f8._M_string_length;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = local_3f8._M_string_length._4_4_;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"ANI file","");
  pOVar5 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_498,(string *)local_278,(string *)local_4e8,&local_348,
                      &local_388);
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"o,output","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Output file","");
  std::
  __shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<std::__cxx11::string>>>
            ((__shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
              *)&local_3c8,
             (allocator<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_338);
  p_Var3 = local_3c8;
  local_3c8 = local_3b8;
  local_4c0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"out.h264","");
  (*(code *)p_Var3->_M_nxt[10]._M_nxt)(&local_3d8,p_Var3,&local_3c8);
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8;
  local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_3d0;
  local_3d8 = (pointer)0x0;
  pbStack_3d0 = (pointer)0x0;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"raw H264 file","");
  pOVar5 = cxxopts::OptionAdder::operator()(pOVar5,&local_3f8,&local_3a8,&local_358,&local_2d8);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"help","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Print help","");
  std::__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<cxxopts::values::standard_value<bool>>>
            ((__shared_ptr<cxxopts::values::standard_value<bool>,(__gnu_cxx::_Lock_policy)2> *)
             &local_1d8,(allocator<cxxopts::values::standard_value<bool>_> *)&local_4e9);
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
       local_1d8;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       uStack_1d4;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = uStack_1d0;
  local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = uStack_1cc;
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
  cxxopts::OptionAdder::operator()(pOVar5,&local_338,&local_2f8,&local_368,&local_318);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_368.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_368.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_368.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_358.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pbStack_3d0 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_3d0);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8,(ulong)((long)&(local_3b8[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_4c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_,
               local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_348.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,
                        local_348.
                        super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_));
  }
  if ((pointer)local_4e8._0_8_ != (pointer)(local_4e8 + 0x10)) {
    operator_delete((void *)local_4e8._0_8_,(ulong)(local_4e8._16_8_ + 1));
  }
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,stack0xfffffffffffffd98 + 1);
  }
  if ((undefined1 *)local_498._8_8_ != local_488 + 8) {
    operator_delete((void *)local_498._8_8_,local_488._8_8_ + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT44(uStack_4a4,local_4a8) + 1);
  }
  local_498._0_8_ = local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"input","");
  plVar9 = (long *)local_468;
  aStack_478._M_allocated_capacity = (size_type)plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_478,"output","");
  __l._M_len = 2;
  __l._M_array = (iterator)local_498;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_4e8,__l,(allocator_type *)&local_3f8);
  unique0x1000140c = local_1a8._184_8_;
  local_278._8_8_ = local_1a8._176_8_;
  local_278._0_8_ = local_1a8._168_8_;
  p_Var1 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            *)(local_1a8 + 0xc0);
  local_1a8._184_8_ = local_4e8._16_8_;
  local_1a8._168_8_ = local_4e8._0_8_;
  local_1a8._176_8_ = local_4e8._8_8_;
  local_4e8._0_8_ = (pointer)0x0;
  local_4e8._8_8_ = (pointer)0x0;
  local_4e8._16_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  uVar4 = local_1a8._176_8_;
  local_278._0_8_ = p_Var1;
  if (local_1a8._168_8_ != local_1a8._176_8_) {
    pbVar11 = (pointer)local_1a8._168_8_;
    do {
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                (p_Var1,pbVar11,local_278);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != (pointer)uVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  lVar10 = -0x40;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0);
  local_468._0_8_ = auStack_438;
  local_498._0_8_ = local_1a8._152_8_;
  local_488._0_8_ = (pointer)0x0;
  local_488._8_8_ = 0;
  aStack_478._0_8_ = 0;
  aStack_478._M_local_buf[8] = local_1a8[0x81];
  local_468._8_8_ = 1;
  local_468._16_8_ = 0;
  local_468._24_8_ = 0;
  local_448._M_p = (pointer)0x3f800000;
  auStack_438._8_8_ = &p_Stack_400;
  local_440 = 0;
  auStack_438._0_8_ = 0;
  _Stack_428._M_p = (pointer)0x1;
  local_420._M_nxt = (_Hash_node_base *)0x0;
  aStack_418._M_allocated_capacity = 0;
  aStack_418._8_8_ = 0x3f800000;
  local_408 = 0;
  p_Stack_400 = (__node_base_ptr)0x0;
  local_498._8_8_ = local_1a8 + 0xa8;
  cxxopts::OptionParser::parse((ParseResult *)local_278,(OptionParser *)local_498,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(auStack_438 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_468);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_488);
  local_498._0_8_ = (Options *)local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"help","");
  sVar6 = cxxopts::ParseResult::count((ParseResult *)local_278,(string *)local_498);
  if ((Options *)local_498._0_8_ != (Options *)local_488) {
    operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
  }
  if (sVar6 == 0) {
    local_498._0_8_ = (Options *)local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"input","");
    sVar6 = cxxopts::ParseResult::count((ParseResult *)local_278,(string *)local_498);
    if ((Options *)local_498._0_8_ != (Options *)local_488) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
    }
    if (sVar6 != 0) {
      local_498._0_8_ = (Options *)local_488;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"input","");
      pOVar7 = cxxopts::ParseResult::operator[]((ParseResult *)local_278,(string *)local_498);
      __source = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
      if ((Options *)local_498._0_8_ != (Options *)local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
      }
      local_498._0_8_ = (Options *)local_488;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"output","");
      pOVar7 = cxxopts::ParseResult::operator[]((ParseResult *)local_278,(string *)local_498);
      __source_00 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar7);
      if ((Options *)local_498._0_8_ != (Options *)local_488) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._0_8_ + 1));
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_498,__source,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_4e8,__source_00,auto_format);
      ani::extract_ani_frames((path *)local_498,(path *)local_4e8);
      std::filesystem::__cxx11::path::~path((path *)local_4e8);
      std::filesystem::__cxx11::path::~path((path *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f0);
      std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_208);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_240);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_278);
      cxxopts::Options::~Options((Options *)local_1a8);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Specify input file",0x12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_4e8._0_8_ = (pointer)0x0;
    local_4e8._8_8_ = (pointer)0x0;
    local_4e8._16_8_ = 0;
    cxxopts::Options::help
              ((string *)local_498,(Options *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4e8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_498._0_8_,local_498._8_8_);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    local_4e8._0_8_ = (pointer)0x0;
    local_4e8._8_8_ = (pointer)0x0;
    local_4e8._16_8_ = 0;
    cxxopts::Options::help
              ((string *)local_498,(Options *)local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4e8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_498._0_8_,local_498._8_8_);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::__cxx11::string::~string((string *)local_498);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4e8);
  exit(0);
}

Assistant:

void parse(int argc, const char* argv[])
{
    try
    {
        cxxopts::Options options(argv[0], " - ani files to h264 bitstream converter");
        options
                .positional_help("[optional args]")
                .show_positional_help();

        options
                .set_width(70)
                .set_tab_expansion()
                .allow_unrecognised_options()
                .add_options()
                        ("i,input", "Input", cxxopts::value<std::string>(), "ANI file")
                        ("o,output", "Output file", cxxopts::value<std::string>()
                                ->default_value("out.h264"), "raw H264 file")
                        ("help", "Print help");

        options.parse_positional({"input", "output"});

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            exit(0);
        }

        if (!result.count("input"))
        {
            std::cout << "Specify input file" << std::endl;
            std::cout << options.help() << std::endl;
            exit(0);
        }

        const auto &input = result["input"].as<std::string>();
        const auto &output = result["output"].as<std::string>();

        ani::extract_ani_frames(input, output);

    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        exit(1);
    }
}